

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

cni_holder_base *
cs_impl::cni::
construct_helper<std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&,cs_impl::any_const&)>
::
_construct<std::__cxx11::string(&)(std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&,cs_impl::any_const&),std::__cxx11::string,std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&,cs_impl::any_const&>
          (_func_any_any_ptr_numeric_ptr_numeric_ptr_any_ptr *val,
          _func_any_any_ptr_numeric_ptr_numeric_ptr_any_ptr *target_function)

{
  cni_holder_base *pcVar1;
  _func_any_any_ptr_numeric_ptr_numeric_ptr_any_ptr **in_stack_00000008;
  cni_holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&,_const_cs_impl::any_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
  *in_stack_00000010;
  _func_any_any_ptr_numeric_ptr_numeric_ptr_any_ptr *in_stack_ffffffffffffffc8;
  _func_any_any_ptr_numeric_ptr_numeric_ptr_any_ptr *in_stack_ffffffffffffffd0;
  
  check_conversion<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&,cs_impl::any_const&,std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&,cs_impl::any_const&>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pcVar1 = (cni_holder_base *)operator_new(0x28);
  cni_holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&,_const_cs_impl::any_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&,_const_cs_impl::any_&)>
  ::cni_holder(in_stack_00000010,in_stack_00000008);
  return pcVar1;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}